

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QMimeMagicRule>::copyAppend
          (QGenericArrayOps<QMimeMagicRule> *this,QMimeMagicRule *b,QMimeMagicRule *e)

{
  qsizetype *pqVar1;
  QMimeMagicRule *pQVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  MatchFunction MVar6;
  int iVar7;
  quint32 qVar8;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QMimeMagicRule>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QMimeMagicRule>).size;
      pDVar4 = (b->m_subMatches).d.d;
      pQVar2[lVar3].m_subMatches.d.d = pDVar4;
      pQVar2[lVar3].m_subMatches.d.ptr = (b->m_subMatches).d.ptr;
      pQVar2[lVar3].m_subMatches.d.size = (b->m_subMatches).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar2[lVar3].m_type = b->m_type;
      pDVar5 = (b->m_value).d.d;
      pQVar2[lVar3].m_value.d.d = pDVar5;
      pQVar2[lVar3].m_value.d.ptr = (b->m_value).d.ptr;
      pQVar2[lVar3].m_value.d.size = (b->m_value).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar7 = b->m_endPos;
      pQVar2[lVar3].m_startPos = b->m_startPos;
      pQVar2[lVar3].m_endPos = iVar7;
      pDVar5 = (b->m_mask).d.d;
      pQVar2[lVar3].m_mask.d.d = pDVar5;
      pQVar2[lVar3].m_mask.d.ptr = (b->m_mask).d.ptr;
      pQVar2[lVar3].m_mask.d.size = (b->m_mask).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar5 = (b->m_pattern).d.d;
      pQVar2[lVar3].m_pattern.d.d = pDVar5;
      pQVar2[lVar3].m_pattern.d.ptr = (b->m_pattern).d.ptr;
      pQVar2[lVar3].m_pattern.d.size = (b->m_pattern).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(undefined8 *)&pQVar2[lVar3].field_0x80 = *(undefined8 *)&b->field_0x80;
      qVar8 = b->m_numberMask;
      MVar6 = b->m_matchFunction;
      pQVar2[lVar3].m_number = b->m_number;
      pQVar2[lVar3].m_numberMask = qVar8;
      pQVar2[lVar3].m_matchFunction = MVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QMimeMagicRule>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }